

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O0

u64 u64Deshuffle(u64 w)

{
  ulong uVar1;
  ulong uVar2;
  u64 t;
  u64 w_local;
  
  uVar1 = (w ^ w >> 1) & 0x2222222222222222;
  uVar2 = uVar1 ^ uVar1 << 1 ^ w;
  uVar1 = (uVar2 ^ uVar2 >> 2) & 0xc0c0c0c0c0c0c0c;
  uVar2 = uVar1 ^ uVar1 << 2 ^ uVar2;
  uVar1 = (uVar2 ^ uVar2 >> 4) & 0xf000f000f000f0;
  uVar2 = uVar1 ^ uVar1 << 4 ^ uVar2;
  uVar1 = (uVar2 ^ uVar2 >> 8) & 0xff000000ff00;
  uVar2 = uVar1 ^ uVar1 << 8 ^ uVar2;
  uVar1 = (uVar2 ^ uVar2 >> 0x10) & 0xffff0000;
  return uVar1 ^ uVar1 << 0x10 ^ uVar2;
}

Assistant:

u64 u64Deshuffle(register u64 w)
{
	register u64 t;
	t = (w ^ (w >> 1 )) & 0x2222222222222222, w ^= t ^ (t << 1);
	t = (w ^ (w >> 2 )) & 0x0C0C0C0C0C0C0C0C, w ^= t ^ (t << 2);
	t = (w ^ (w >> 4 )) & 0x00F000F000F000F0, w ^= t ^ (t << 4);
	t = (w ^ (w >> 8 )) & 0x0000FF000000FF00, w ^= t ^ (t << 8);
	t = (w ^ (w >> 16)) & 0x00000000FFFF0000, w ^= t ^ (t << 16);
	t = 0;
	return w;
}